

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O2

void __thiscall
reader_authority_suite::test_ipv6_line_9g_v6::test_method(test_ipv6_line_9g_v6 *this)

{
  undefined4 local_108;
  value local_104;
  view_type local_100;
  undefined8 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  authority reader;
  char input [39];
  
  local_100.ptr_ = input;
  builtin_strncpy(input,"[1111:2222:3333:4444:5555:6666:7777::]",0x27);
  local_100.len_ = strlen(local_100.ptr_);
  trial::url::reader::basic_authority<char>::basic_authority(&reader,&local_100);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x209);
  local_100.len_ = local_100.len_ & 0xffffffffffffff00;
  local_100.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_a8 = "";
  local_104 = reader.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_108 = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_100,&local_b0,0x209,2,2,&local_104,"reader.subcode()",&local_108,
             "url::token::subcode::authority_host_ipv6");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x20a);
  local_100.len_ = local_100.len_ & 0xffffffffffffff00;
  local_100.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_f0 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[37]>
            (&local_100,&local_e0,0x20a,2,2,
             &reader.super_base<char,_trial::url::reader::basic_authority>.current_view,
             "reader.literal()","1111:2222:3333:4444:5555:6666:7777::",
             "\"1111:2222:3333:4444:5555:6666:7777::\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_9g_v6)
{
    const char input[] = "[1111:2222:3333:4444:5555:6666:7777::]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111:2222:3333:4444:5555:6666:7777::");
}